

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestCaseGroup * vkt::shaderexecutor::createFuncGroup(PrecisionTestContext *ctx,CaseFactory *factory)

{
  ShaderType shaderType;
  int iVar1;
  TestContext *pTVar2;
  long lVar3;
  TestNode *node;
  TestNode *this;
  char *pcVar4;
  pointer pSVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  ulong uVar9;
  string name;
  string precName;
  string shaderName;
  CaseContext caseCtx;
  long *local_140;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110 [2];
  TestNode *local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  CaseFactory *local_d0;
  FloatFormat *local_c8;
  FloatFormat *local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  TestContext *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  double local_70;
  int local_68;
  int iStack_64;
  int iStack_60;
  YesNoMaybe YStack_5c;
  YesNoMaybe local_58;
  YesNoMaybe YStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  Precision local_40;
  ShaderType local_3c;
  long local_38;
  
  this = (TestNode *)operator_new(0x70);
  pTVar2 = ctx->testCtx;
  (*factory->_vptr_CaseFactory[3])(local_b8,factory);
  plVar6 = local_b8[0];
  (*factory->_vptr_CaseFactory[4])(&local_120,factory);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,pTVar2,(char *)plVar6,(char *)local_120);
  if (local_120 != local_110) {
    operator_delete(local_120,local_110[0] + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  lVar8 = 1;
  local_d0 = factory;
  do {
    pcVar4 = glu::getPrecisionName((Precision)lVar8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,pcVar4,(allocator<char> *)local_b8);
    pSVar5 = (ctx->shaderTypes).
             super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ctx->shaderTypes).super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar5) {
      local_c0 = ctx->formats[lVar8];
      local_c8 = ctx->formats[2];
      uVar9 = 0;
      do {
        local_140 = &local_130;
        shaderType = pSVar5[uVar9];
        pcVar4 = glu::getShaderTypeName(shaderType);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f0,pcVar4,(allocator<char> *)local_b8);
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,local_120,(long)local_120 + local_118);
        std::__cxx11::string::append((char *)local_b8);
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_b8,(ulong)local_f0[0]);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_130 = *plVar7;
          lStack_128 = plVar6[3];
        }
        else {
          local_130 = *plVar7;
          local_140 = (long *)*plVar6;
        }
        lVar3 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        pTVar2 = ctx->testCtx;
        iVar1 = ctx->numRandoms;
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,local_140,lVar3 + (long)local_140);
        local_70 = local_c0->m_maxValue;
        local_90._0_4_ = local_c0->m_minExp;
        local_90._4_4_ = local_c0->m_maxExp;
        uStack_88._0_4_ = local_c0->m_fractionBits;
        uStack_88._4_4_ = local_c0->m_hasSubnormal;
        local_80._0_4_ = local_c0->m_hasInf;
        local_80._4_4_ = local_c0->m_hasNaN;
        uStack_78 = *(undefined8 *)&local_c0->m_exactPrecision;
        local_48 = local_c8->m_maxValue;
        local_68 = local_c8->m_minExp;
        iStack_64 = local_c8->m_maxExp;
        iStack_60 = local_c8->m_fractionBits;
        YStack_5c = local_c8->m_hasSubnormal;
        local_58 = local_c8->m_hasInf;
        YStack_54 = local_c8->m_hasNaN;
        uStack_50 = *(undefined4 *)&local_c8->m_exactPrecision;
        uStack_4c = *(undefined4 *)&local_c8->field_0x1c;
        local_98 = pTVar2;
        local_40 = (Precision)lVar8;
        local_3c = shaderType;
        local_38 = (long)iVar1;
        (*local_d0->_vptr_CaseFactory[2])(local_100,local_d0,(string *)local_b8);
        node = local_100[0];
        local_100[0] = (TestNode *)0x0;
        tcu::TestNode::addChild(this,node);
        if (local_100[0] != (TestNode *)0x0) {
          (*local_100[0]->_vptr_TestNode[1])();
        }
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140,local_130 + 1);
        }
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        uVar9 = uVar9 + 1;
        pSVar5 = (ctx->shaderTypes).
                 super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar9 < (ulong)((long)(ctx->shaderTypes).
                                     super__Vector_base<glu::ShaderType,_std::allocator<glu::ShaderType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 2)
              );
    }
    if (local_120 != local_110) {
      operator_delete(local_120,local_110[0] + 1);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  return (TestCaseGroup *)this;
}

Assistant:

TestCaseGroup* createFuncGroup (const PrecisionTestContext&	ctx, const CaseFactory& factory)
{
	TestCaseGroup* const	group	= new TestCaseGroup(ctx.testCtx, factory.getName().c_str(), factory.getDesc().c_str());

	for (int precNdx = glu::PRECISION_MEDIUMP; precNdx < glu::PRECISION_LAST; ++precNdx)
	{
		const Precision		precision	= Precision(precNdx);
		const string		precName	(glu::getPrecisionName(precision));
		const FloatFormat&	fmt			= *de::getSizedArrayElement<glu::PRECISION_LAST>(ctx.formats, precNdx);
		const FloatFormat&	highpFmt	= *de::getSizedArrayElement<glu::PRECISION_LAST>(ctx.formats,
																						 glu::PRECISION_HIGHP);

		for (size_t shaderNdx = 0; shaderNdx < ctx.shaderTypes.size(); ++shaderNdx)
		{
			const ShaderType	shaderType	= ctx.shaderTypes[shaderNdx];
			const string		shaderName	(glu::getShaderTypeName(shaderType));
			const string		name		= precName + "_" + shaderName;
			const CaseContext	caseCtx		(name, ctx.testCtx, fmt, highpFmt,
											 precision, shaderType, ctx.numRandoms);

			group->addChild(factory.createCase(caseCtx).release());
		}
	}

	return group;
}